

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

void Abc_NodeConeCollect(Abc_Obj_t **ppRoots,int nRoots,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited,
                        int fIncludeFanins)

{
  void *pvVar1;
  int i;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  for (iVar2 = 0; iVar2 < vLeaves->nSize; iVar2 = iVar2 + 1) {
    pvVar1 = Vec_PtrEntry(vLeaves,iVar2);
    *(byte *)((long)pvVar1 + 0x14) = *(byte *)((long)pvVar1 + 0x14) | 0x10;
  }
  vVisited->nSize = 0;
  if (fIncludeFanins != 0) {
    for (iVar2 = 0; iVar2 < vLeaves->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(vLeaves,iVar2);
      Vec_PtrPush(vVisited,pvVar1);
    }
  }
  uVar3 = 0;
  uVar4 = (ulong)(uint)nRoots;
  if (nRoots < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    Abc_NodeConeMarkCollect_rec(ppRoots[uVar3],vVisited);
  }
  Abc_NodesUnmark(vLeaves);
  Abc_NodesUnmark(vVisited);
  return;
}

Assistant:

void Abc_NodeConeCollect( Abc_Obj_t ** ppRoots, int nRoots, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited, int fIncludeFanins )
{
    Abc_Obj_t * pTemp;
    int i;
    // mark the fanins of the cone
    Abc_NodesMark( vLeaves );
    // collect the nodes in the DFS order
    Vec_PtrClear( vVisited );
    // add the fanins
    if ( fIncludeFanins )
        Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pTemp, i )
            Vec_PtrPush( vVisited, pTemp );
    // add other nodes
    for ( i = 0; i < nRoots; i++ )
        Abc_NodeConeMarkCollect_rec( ppRoots[i], vVisited );
    // unmark both sets
    Abc_NodesUnmark( vLeaves );
    Abc_NodesUnmark( vVisited );
}